

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-c.cpp
# Opt level: O1

duckdb_interval duckdb_value_interval(duckdb_result *result,idx_t col,idx_t row)

{
  duckdb_interval dVar1;
  undefined8 extraout_RAX;
  int64_t extraout_RDX;
  
  duckdb::GetInternalCValue<duckdb::interval_t,duckdb::TryCast>(result,col,row);
  dVar1.micros = extraout_RDX;
  dVar1.months = (int)extraout_RAX;
  dVar1.days = (int)((ulong)extraout_RAX >> 0x20);
  return dVar1;
}

Assistant:

duckdb_interval duckdb_value_interval(duckdb_result *result, idx_t col, idx_t row) {
	duckdb_interval result_value;
	auto ival = GetInternalCValue<interval_t>(result, col, row);
	result_value.months = ival.months;
	result_value.days = ival.days;
	result_value.micros = ival.micros;
	return result_value;
}